

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

void __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::
RemoveAllocator(HeapBucketT<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
                *this,TBlockAllocatorType *allocator)

{
  undefined4 *puVar1;
  SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
  *pSVar2;
  SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>
  *pSVar3;
  code *pcVar4;
  bool bVar5;
  undefined8 *in_FS_OFFSET;
  
  if (&this->allocatorHead == allocator) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x136,"(allocator != &this->allocatorHead)",
                       "allocator != &this->allocatorHead");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar1 = 0;
  }
  SmallHeapBlockAllocator<Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>_>::
  Clear(allocator);
  pSVar2 = allocator->prev;
  pSVar3 = allocator->next;
  pSVar3->prev = pSVar2;
  pSVar2->next = pSVar3;
  if (this->lastExplicitFreeListAllocator == allocator) {
    this->lastExplicitFreeListAllocator = &this->allocatorHead;
  }
  return;
}

Assistant:

void
HeapBucketT<TBlockType>::RemoveAllocator(TBlockAllocatorType * allocator)
{
    Assert(allocator != &this->allocatorHead);
    ClearAllocator(allocator);

    allocator->next->prev = allocator->prev;
    allocator->prev->next = allocator->next;

    if (allocator == this->lastExplicitFreeListAllocator)
    {
        this->lastExplicitFreeListAllocator = &allocatorHead;
    }
}